

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

void __thiscall
sf2cute::SoundFont::RemoveSampleIf
          (SoundFont *this,function<bool_(const_std::shared_ptr<sf2cute::SFSample>_&)> *predicate)

{
  __normal_iterator<std::shared_ptr<sf2cute::SFSample>_*,_std::vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>_>
  local_50;
  const_iterator local_48;
  function<bool_(const_std::shared_ptr<sf2cute::SFSample>_&)> *local_40;
  shared_ptr<sf2cute::SFSample> *local_38;
  __normal_iterator<std::shared_ptr<sf2cute::SFSample>_*,_std::vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>_>
  local_30;
  __normal_iterator<std::shared_ptr<sf2cute::SFSample>_*,_std::vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>_>
  local_28;
  const_iterator local_20;
  function<bool_(const_std::shared_ptr<sf2cute::SFSample>_&)> *local_18;
  function<bool_(const_std::shared_ptr<sf2cute::SFSample>_&)> *predicate_local;
  SoundFont *this_local;
  
  local_18 = predicate;
  predicate_local = (function<bool_(const_std::shared_ptr<sf2cute::SFSample>_&)> *)this;
  local_30._M_current =
       (shared_ptr<sf2cute::SFSample> *)
       std::
       vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
       ::begin(&this->samples_);
  local_38 = (shared_ptr<sf2cute::SFSample> *)
             std::
             vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
             ::end(&this->samples_);
  local_40 = predicate;
  local_28 = std::
             remove_if<__gnu_cxx::__normal_iterator<std::shared_ptr<sf2cute::SFSample>*,std::vector<std::shared_ptr<sf2cute::SFSample>,std::allocator<std::shared_ptr<sf2cute::SFSample>>>>,sf2cute::SoundFont::RemoveSampleIf(std::function<bool(std::shared_ptr<sf2cute::SFSample>const&)>)::__0>
                       (local_30,(__normal_iterator<std::shared_ptr<sf2cute::SFSample>_*,_std::vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>_>
                                  )local_38,(anon_class_8_1_c53f3057_for__M_pred)predicate);
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<sf2cute::SFSample>const*,std::vector<std::shared_ptr<sf2cute::SFSample>,std::allocator<std::shared_ptr<sf2cute::SFSample>>>>
  ::__normal_iterator<std::shared_ptr<sf2cute::SFSample>*>
            ((__normal_iterator<std::shared_ptr<sf2cute::SFSample>const*,std::vector<std::shared_ptr<sf2cute::SFSample>,std::allocator<std::shared_ptr<sf2cute::SFSample>>>>
              *)&local_20,&local_28);
  local_50._M_current =
       (shared_ptr<sf2cute::SFSample> *)
       std::
       vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
       ::end(&this->samples_);
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<sf2cute::SFSample>const*,std::vector<std::shared_ptr<sf2cute::SFSample>,std::allocator<std::shared_ptr<sf2cute::SFSample>>>>
  ::__normal_iterator<std::shared_ptr<sf2cute::SFSample>*>
            ((__normal_iterator<std::shared_ptr<sf2cute::SFSample>const*,std::vector<std::shared_ptr<sf2cute::SFSample>,std::allocator<std::shared_ptr<sf2cute::SFSample>>>>
              *)&local_48,&local_50);
  std::
  vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>::
  erase(&this->samples_,local_20,local_48);
  return;
}

Assistant:

void SoundFont::RemoveSampleIf(
    std::function<bool(const std::shared_ptr<SFSample> &)> predicate) {
  samples_.erase(std::remove_if(samples_.begin(), samples_.end(),
    [&predicate](const std::shared_ptr<SFSample> & sample) -> bool {
      if (predicate(sample)) {
        sample->reset_parent_file();
        return true;
      }
      else {
        return false;
      }
    }), samples_.end());
}